

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::LICMPass::ProcessFunction(LICMPass *this,Function *f)

{
  NodePtr pLVar1;
  Status SVar2;
  LoopDescriptor *pLVar3;
  Status SVar4;
  iterator it;
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  local_80;
  
  pLVar3 = IRContext::GetLoopDescriptor((this->super_Pass).context_,f);
  PostOrderTreeDFIterator<spvtools::opt::Loop>::PostOrderTreeDFIterator
            (&it,&pLVar3->placeholder_top_loop_);
  SVar4 = SuccessWithoutChange;
  while( true ) {
    std::
    stack<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>>
    ::
    stack<std::deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>,void>
              ((stack<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>_>
                *)&local_80);
    pLVar1 = it.current_;
    std::
    _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
    ::~_Deque_base(&local_80);
    if ((pLVar1 == &pLVar3->placeholder_top_loop_) || (SVar4 == Failure)) break;
    if ((it.current_)->parent_ == (Loop *)0x0) {
      SVar2 = ProcessLoop(this,it.current_,f);
      if ((int)SVar2 < (int)SVar4) {
        SVar4 = SVar2;
      }
    }
    PostOrderTreeDFIterator<spvtools::opt::Loop>::MoveToNextNode(&it);
  }
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)&it.parent_iterators_);
  return SVar4;
}

Assistant:

Pass::Status LICMPass::ProcessFunction(Function* f) {
  Status status = Status::SuccessWithoutChange;
  LoopDescriptor* loop_descriptor = context()->GetLoopDescriptor(f);

  // Process each loop in the function
  for (auto it = loop_descriptor->begin();
       it != loop_descriptor->end() && status != Status::Failure; ++it) {
    Loop& loop = *it;
    // Ignore nested loops, as we will process them in order in ProcessLoop
    if (loop.IsNested()) {
      continue;
    }
    status = CombineStatus(status, ProcessLoop(&loop, f));
  }
  return status;
}